

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseStack.c
# Opt level: O0

Parse_StackOp_t * Parse_StackOpStart(int nDepth)

{
  Parse_StackOp_t *__s;
  int *piVar1;
  Parse_StackOp_t *p;
  int nDepth_local;
  
  __s = (Parse_StackOp_t *)malloc(0x10);
  memset(__s,0,0x10);
  piVar1 = (int *)malloc((long)nDepth << 2);
  __s->pData = piVar1;
  __s->Size = nDepth;
  return __s;
}

Assistant:

Parse_StackOp_t * Parse_StackOpStart( int nDepth )
{
    Parse_StackOp_t * p;
    p = ABC_ALLOC( Parse_StackOp_t, 1 );
    memset( p, 0, sizeof(Parse_StackOp_t) );
    p->pData = ABC_ALLOC( int, nDepth );
    p->Size = nDepth;
    return p;
}